

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O1

int flatbuffers::Vector<flatbuffers::Offset<MyGame::Example::Monster>,unsigned_int>::
    KeyCompare<std::basic_string_view<char,std::char_traits<char>>>(void *ap,void *bp)

{
  int iVar1;
  
  iVar1 = MyGame::Example::Monster::
          KeyCompareWithValue<std::basic_string_view<char,std::char_traits<char>>>
                    ((Monster *)((ulong)*bp + (long)bp),
                     (basic_string_view<char,_std::char_traits<char>_> *)ap);
  return -iVar1;
}

Assistant:

static int KeyCompare(const void *ap, const void *bp) {
    const K *key = reinterpret_cast<const K *>(ap);
    const uint8_t *data = reinterpret_cast<const uint8_t *>(bp);
    auto table = IndirectHelper<T>::Read(data, 0);

    // std::bsearch compares with the operands transposed, so we negate the
    // result here.
    return -table->KeyCompareWithValue(*key);
  }